

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone
          (SFInstrumentZone *this,weak_ptr<sf2cute::SFSample> *sample,
          vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *generators,
          vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *modulators)

{
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> local_58;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> local_40;
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *local_28;
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *modulators_local;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *generators_local;
  weak_ptr<sf2cute::SFSample> *sample_local;
  SFInstrumentZone *this_local;
  
  local_28 = modulators;
  modulators_local =
       (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)generators;
  generators_local =
       (vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)sample;
  sample_local = (weak_ptr<sf2cute::SFSample> *)this;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            (&local_40,generators);
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::vector
            (&local_58,modulators);
  SFZone::SFZone(&this->super_SFZone,&local_40,&local_58);
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::~vector
            (&local_58);
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::~vector
            (&local_40);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_00163750;
  std::weak_ptr<sf2cute::SFSample>::weak_ptr(&this->sample_,sample);
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(std::weak_ptr<SFSample> sample,
    std::vector<SFGeneratorItem> generators,
    std::vector<SFModulatorItem> modulators) :
    SFZone(std::move(generators), std::move(modulators)),
    sample_(std::move(sample)),
    parent_instrument_(nullptr) {
}